

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test4(void)

{
  bool bVar1;
  undefined1 local_90 [8];
  vector<int> w2;
  vector<int> v2;
  int local_58;
  int i_1;
  int i;
  int n2;
  int n1;
  undefined1 local_40 [8];
  vector<int> w;
  vector<int> v;
  
  CP::vector<int>::vector((vector<int> *)&w.mSize,10);
  CP::vector<int>::vector((vector<int> *)local_40,3);
  i = 500000;
  i_1 = 200000;
  for (local_58 = 0; local_58 < i; local_58 = local_58 + 1) {
    CP::vector<int>::push_back((vector<int> *)&w.mSize,&local_58);
  }
  for (v2.mSize._4_4_ = 0; v2.mSize._4_4_ < i_1; v2.mSize._4_4_ = v2.mSize._4_4_ + 1) {
    v2.mSize._0_4_ = v2.mSize._4_4_ * -2;
    CP::vector<int>::push_back((vector<int> *)local_40,(int *)&v2.mSize);
  }
  CP::vector<int>::vector((vector<int> *)&w2.mSize,(vector<int> *)&w.mSize);
  CP::vector<int>::vector((vector<int> *)local_90,(vector<int> *)local_40);
  CP::vector<int>::swap((vector<int> *)&w.mSize,(vector<int> *)local_40);
  bVar1 = CP::vector<int>::operator==((vector<int> *)&w.mSize,(vector<int> *)local_90);
  if ((bVar1) &&
     (bVar1 = CP::vector<int>::operator==((vector<int> *)local_40,(vector<int> *)&w2.mSize), bVar1))
  {
    v.mSize._7_1_ = true;
  }
  else {
    v.mSize._7_1_ = false;
  }
  CP::vector<int>::~vector((vector<int> *)local_90);
  CP::vector<int>::~vector((vector<int> *)&w2.mSize);
  CP::vector<int>::~vector((vector<int> *)local_40);
  CP::vector<int>::~vector((vector<int> *)&w.mSize);
  return v.mSize._7_1_;
}

Assistant:

bool test4() {
  CP::vector<int> v(10);
  CP::vector<int> w(3);
  int n1 = 500000;
  int n2 = 200000;
  for (int i = 0;i < n1;i++) v.push_back(i);
  for (int i = 0;i < n2;i++) w.push_back(-i*2);

  CP::vector<int> v2(v);
  CP::vector<int> w2(w);
  v.swap(w);
  if (v == w2 && w == v2) return true;
  return false;
}